

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTSynthetic.cpp
# Opt level: O0

bool __thiscall SyntheticConnection::ProcessFetchedData(SyntheticConnection *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  time_t tVar4;
  pointer ppVar5;
  LTFlightData *this_00;
  double *pdVar6;
  undefined8 in_RDI;
  double dVar7;
  lock_guard<std::recursive_mutex> fdLock;
  FDDynamicData dyn;
  LTFlightData *fd;
  unique_lock<std::mutex> mapLock;
  SynDataTy *parkDat;
  FDKeyTy *key;
  iterator i;
  double distSearchSqr;
  positionTy posCam;
  double tNow;
  positionTy *in_stack_fffffffffffffd88;
  positionTy *in_stack_fffffffffffffd90;
  iterator in_stack_fffffffffffffd98;
  positionTy *in_stack_fffffffffffffda8;
  undefined4 in_stack_fffffffffffffdb0;
  logLevelTy in_stack_fffffffffffffdb4;
  key_type *in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  double in_stack_fffffffffffffdd8;
  LTFlightData *in_stack_fffffffffffffde0;
  double in_stack_fffffffffffffe60;
  FDStaticData *in_stack_fffffffffffffe68;
  LTFlightData *in_stack_fffffffffffffe70;
  positionTy local_f0;
  positionTy *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  LTFlightData *in_stack_ffffffffffffff70;
  _Self local_70;
  _Self local_68;
  double local_60;
  key_type *local_10;
  
  tVar4 = time((time_t *)0x0);
  local_10 = (key_type *)(double)tVar4;
  DataRefs::GetViewPos();
  iVar2 = DataRefs::GetFdStdDistance_m(&dataRefs);
  local_60 = sqr<double>((double)iVar2);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>_>
       ::begin((map<LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>_>
                *)in_stack_fffffffffffffd88);
  do {
    while( true ) {
      local_70._M_node =
           (_Base_ptr)
           std::
           map<LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>_>
           ::end((map<LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>_>
                  *)in_stack_fffffffffffffd88);
      bVar1 = std::operator!=(&local_68,&local_70);
      if (!bVar1) {
        return true;
      }
      std::
      _Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>::
      operator->((_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>
                  *)0x22e814);
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>
                             *)0x22e829);
      dVar7 = positionTy::distRoughSqr
                        ((positionTy *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)
                         ,in_stack_fffffffffffffda8);
      if (dVar7 <= local_60) break;
      std::
      _Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>::
      operator++((_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>
                  *)in_stack_fffffffffffffd90);
    }
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)in_stack_fffffffffffffd90,
               (mutex_type *)in_stack_fffffffffffffd88);
    this_00 = std::
              map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
              ::operator[]((map<LTFlightData::FDKeyTy,_LTFlightData,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
                            *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                           in_stack_fffffffffffffdc8);
    std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)in_stack_fffffffffffffd90);
    pdVar6 = positionTy::heading(&(ppVar5->second).pos);
    uVar3 = std::isnan(*pdVar6);
    if ((uVar3 & 1) == 0) {
LAB_0022ea4e:
      LTFlightData::FDDynamicData::FDDynamicData((FDDynamicData *)in_stack_fffffffffffffd90);
      positionTy::heading(&(ppVar5->second).pos);
      (ppVar5->second).pos.f =
           (posFlagsTy)((ushort)*(undefined4 *)&(ppVar5->second).pos.f & 0xcfff | 0x1000);
      (ppVar5->second).pos.f = (posFlagsTy)((ushort)(ppVar5->second).pos.f | 0x80);
      (ppVar5->second).pos.f =
           (posFlagsTy)((ushort)*(undefined4 *)&(ppVar5->second).pos.f & 0xff80 | 5);
      std::lock_guard<std::recursive_mutex>::lock_guard
                ((lock_guard<std::recursive_mutex> *)in_stack_fffffffffffffd90,
                 (mutex_type *)in_stack_fffffffffffffd88);
      LTFlightData::key(this_00);
      bVar1 = LTFlightData::FDKeyTy::empty((FDKeyTy *)0x22eb53);
      if (bVar1) {
        in_stack_fffffffffffffde0 = this_00;
        LTFlightData::SetKey
                  ((LTFlightData *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),
                   (FDKeyTy *)in_stack_fffffffffffffda8);
        this_00 = in_stack_fffffffffffffde0;
        DataRefs::GetViewPos();
        in_stack_fffffffffffffdd8 =
             positionTy::dist(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        LTFlightData::UpdateData
                  (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                   (DatRequTy)((ulong)in_RDI >> 0x20));
        in_stack_fffffffffffffdc8 = local_10;
        in_stack_fffffffffffffdd4 = DataRefs::GetFdBufPeriod(&dataRefs);
        dVar7 = (double)in_stack_fffffffffffffdc8 - (double)in_stack_fffffffffffffdd4;
        pdVar6 = positionTy::ts(&(ppVar5->second).pos);
        *pdVar6 = dVar7;
        LTFlightData::AddDynData
                  (in_stack_ffffffffffffff70,(FDDynamicData *)this_00,in_stack_ffffffffffffff64,
                   in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
        in_stack_fffffffffffffdb4 = DataRefs::GetLogLevel(&dataRefs);
        if ((int)in_stack_fffffffffffffdb4 < 1) {
          in_stack_fffffffffffffda8 =
               (positionTy *)LTFlightData::FDKeyTy::c_str((FDKeyTy *)0x22eca3);
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTSynthetic.cpp"
                 ,0xdb,"ProcessFetchedData",logDEBUG,"Created parked aircraft %s",
                 in_stack_fffffffffffffda8);
        }
      }
      in_stack_fffffffffffffd98._M_node = (_Base_ptr)local_10;
      iVar2 = DataRefs::GetFdRefreshIntvl(&dataRefs);
      in_stack_fffffffffffffd88 =
           (positionTy *)((double)in_stack_fffffffffffffd98._M_node - (double)(iVar2 / 2));
      in_stack_fffffffffffffd90 = (positionTy *)positionTy::ts(&(ppVar5->second).pos);
      ((XPMPPlaneRadar_t *)&in_stack_fffffffffffffd90->_lat)->size = (long)in_stack_fffffffffffffd88
      ;
      LTFlightData::AddDynData
                (in_stack_ffffffffffffff70,(FDDynamicData *)this_00,in_stack_ffffffffffffff64,
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      std::
      _Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>::
      operator++((_Rb_tree_iterator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>
                  *)in_stack_fffffffffffffd90);
      std::lock_guard<std::recursive_mutex>::~lock_guard
                ((lock_guard<std::recursive_mutex> *)0x22edb5);
    }
    else {
      LTAptFindStartupLoc((positionTy *)in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                          (double *)CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      pdVar6 = positionTy::heading(&local_f0);
      dVar7 = *pdVar6;
      pdVar6 = positionTy::heading(&(ppVar5->second).pos);
      *pdVar6 = dVar7;
      pdVar6 = positionTy::heading(&(ppVar5->second).pos);
      uVar3 = std::isnan(*pdVar6);
      if ((uVar3 & 1) == 0) goto LAB_0022ea4e;
      local_68._M_node =
           (_Base_ptr)
           std::
           map<LTFlightData::FDKeyTy,SyntheticConnection::SynDataTy,std::less<LTFlightData::FDKeyTy>,std::allocator<std::pair<LTFlightData::FDKeyTy_const,SyntheticConnection::SynDataTy>>>
           ::erase_abi_cxx11_((map<LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_SyntheticConnection::SynDataTy>_>_>
                               *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)in_stack_fffffffffffffd90)
    ;
  } while( true );
}

Assistant:

bool SyntheticConnection::ProcessFetchedData ()
{
    // Timestamp with which we send the data
    const double tNow = (double)std::time(nullptr);
    // Camera pos
    const positionTy posCam = dataRefs.GetViewPos();
    // Squared search distance for distance comparison
    const double distSearchSqr = sqr(double(dataRefs.GetFdStdDistance_m()));
    
    // --- Parked Aircraft ---
    // For all stored aircraft
    // - lookup heading to have them point into the right direction of the startup position
    // - send an dynamic data update for LiveTraffic to process
    for (auto i = mapSynData.begin(); i != mapSynData.end();) {
        const LTFlightData::FDKeyTy& key = i->first;
        SynDataTy& parkDat = i->second;

        // Only process planes in search distance
        // We keep the data in memory, just in case we come back, but we don't feed data for unneeded planes
        if (parkDat.pos.distRoughSqr(posCam) > distSearchSqr) {
            ++i;                                                // next plane
            continue;
        }

        // Find the related flight data
        std::unique_lock<std::mutex> mapLock (mapFdMutex);      // lock the entire map
        LTFlightData& fd = mapFd[key];                          // fetch or create flight data
        mapLock.unlock();                                       // release the map lock
        
        // Haven't yet looked up startup position's heading?
        if (std::isnan(parkDat.pos.heading())) {
            parkDat.pos.heading() = LTAptFindStartupLoc(parkDat.pos).heading();
            // Still have no heading? That means we don't have a startup position...should not happen but does
            if (std::isnan(parkDat.pos.heading()))
            {
                i = mapSynData.erase(i);
                continue;
            }
        }
        
        // Send position for LiveTraffic's processing
        LTFlightData::FDDynamicData dyn;
        dyn.pChannel = this;
        dyn.spd = 0.0;
        dyn.vsi = 0.0;
        dyn.gnd = true;
        dyn.heading = parkDat.pos.heading();
        parkDat.pos.f.specialPos = SPOS_STARTUP;
        parkDat.pos.f.bHeadFixed = true;
        parkDat.pos.f.flightPhase = FPH_PARKED;

        // Update flight data
        std::lock_guard<std::recursive_mutex> fdLock (fd.dataAccessMutex);
        if (fd.key().empty()) {                                 // just created!
            // a/c exists no longer, we re-create it, can happen after disable/enable
            fd.SetKey(key);
            fd.UpdateData(parkDat.stat, parkDat.pos.dist(dataRefs.GetViewPos()));
            // to speed up creation of the actual aircraft we send the position for a past timestamp first
            dyn.ts = parkDat.pos.ts() = tNow - dataRefs.GetFdBufPeriod();
            fd.AddDynData(dyn, 0, 0, &parkDat.pos);
            LOG_MSG(logDEBUG, "Created parked aircraft %s", key.c_str());
        }

        // Add a (nearly) _current_ data item
        // We reduce timestamp a bit so we don't appear better than live stream's data,
        // which can't be current up to the minute
        dyn.ts = parkDat.pos.ts() = tNow - double(dataRefs.GetFdRefreshIntvl()/2);
        fd.AddDynData(dyn, 0, 0, &parkDat.pos);
        
        // next plane
        ++i;
    }
    return true;
}